

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  undefined8 uVar1;
  NeuralNetworkLayer *pNVar2;
  bool bVar3;
  int iVar4;
  UniDirectionalLSTMLayerParams *pUVar5;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *this_00;
  reference params;
  LSTMWeightParams *pLVar6;
  LSTMParams *pLVar7;
  uint64_t uVar8;
  string *psVar9;
  WeightParams *pWVar10;
  uint64_t uVar11;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  byte local_5da;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  byte local_58a;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  byte local_53a;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  byte local_4ea;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  byte local_49a;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  byte local_44a;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  byte local_3fa;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  byte local_3aa;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  byte local_35a;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  byte local_30a;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  byte local_2ba;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  byte local_26a;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  byte local_21a;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  byte local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  byte local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string err;
  uint64_t h;
  uint64_t x;
  UniDirectionalLSTMLayerParams recurrent;
  ActivationParams *activation;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range1;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,3);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  local_39 = 0;
  validateOutputCount(__return_storage_ptr__,local_20,3,3);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_39 = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_39 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  pNVar2 = local_20;
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    local_3a = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"UniDirectionalLSTM",&local_61);
    validateInputOutputRankEquality(__return_storage_ptr__,pNVar2,&local_60,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      local_3a = 1;
    }
    local_38 = (uint)!bVar3;
    if ((local_3a & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar2 = local_20;
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
    local_62 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"UniDirectionalLSTM",(allocator<char> *)((long)&__range1 + 7));
    validateRankCount(__return_storage_ptr__,pNVar2,&local_88,5,5,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      local_62 = 1;
    }
    local_38 = (uint)!bVar3;
    if ((local_62 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
  }
  pUVar5 = Specification::NeuralNetworkLayer::unidirectionallstm(local_20);
  this_00 = Specification::UniDirectionalLSTMLayerParams::activations(pUVar5);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::begin
                     (this_00);
  activation = (ActivationParams *)
               google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                         (this_00);
  while (bVar3 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator!=
                           (&__end1,(iterator *)&activation), bVar3) {
    params = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator*(&__end1);
    validateRecurrentActivationParams(__return_storage_ptr__,params);
    bVar3 = Result::good(__return_storage_ptr__);
    local_38 = (uint)!bVar3;
    if (bVar3) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
    operator++(&__end1);
  }
  pUVar5 = Specification::NeuralNetworkLayer::unidirectionallstm(local_20);
  pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams(pUVar5);
  pUVar5 = Specification::NeuralNetworkLayer::unidirectionallstm(local_20);
  pLVar7 = Specification::UniDirectionalLSTMLayerParams::params(pUVar5);
  Specification::LSTMParams::LSTMParams((LSTMParams *)&recurrent.reverseinput_,pLVar7);
  validateLSTMWeightParams(__return_storage_ptr__,pLVar6,(LSTMParams *)&recurrent.reverseinput_);
  Specification::LSTMParams::~LSTMParams((LSTMParams *)&recurrent.reverseinput_);
  bVar3 = Result::good(__return_storage_ptr__);
  local_38 = (uint)!bVar3;
  if (bVar3) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  pUVar5 = Specification::NeuralNetworkLayer::unidirectionallstm(local_20);
  Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)&x,pUVar5);
  uVar8 = Specification::UniDirectionalLSTMLayerParams::inputvectorsize
                    ((UniDirectionalLSTMLayerParams *)&x);
  err.field_2._8_8_ =
       Specification::UniDirectionalLSTMLayerParams::outputvectorsize
                 ((UniDirectionalLSTMLayerParams *)&x);
  iVar4 = Specification::UniDirectionalLSTMLayerParams::activations_size
                    ((UniDirectionalLSTMLayerParams *)&x);
  if (iVar4 == 3) {
    local_179 = 0;
    pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                       ((UniDirectionalLSTMLayerParams *)&x);
    pWVar10 = Specification::LSTMWeightParams::inputgateweightmatrix(pLVar6);
    uVar1 = err.field_2._8_8_;
    uVar11 = err.field_2._8_8_ * uVar8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Unidirectional LSTM",&local_1a1);
    psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"input gate weight matrix",&local_1c9);
    validateGeneralWeightParams
              (__return_storage_ptr__,pWVar10,uVar11,uVar1,&local_1a0,psVar9,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      local_179 = 1;
    }
    local_38 = (uint)!bVar3;
    if ((local_179 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 == 0) {
      local_1ca = 0;
      pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                         ((UniDirectionalLSTMLayerParams *)&x);
      pWVar10 = Specification::LSTMWeightParams::forgetgateweightmatrix(pLVar6);
      uVar1 = err.field_2._8_8_;
      uVar11 = err.field_2._8_8_ * uVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"Unidirectional LSTM",&local_1f1);
      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"forget gate weight matrix",&local_219);
      validateGeneralWeightParams
                (__return_storage_ptr__,pWVar10,uVar11,uVar1,&local_1f0,psVar9,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      bVar3 = Result::good(__return_storage_ptr__);
      if (!bVar3) {
        local_1ca = 1;
      }
      local_38 = (uint)!bVar3;
      if ((local_1ca & 1) == 0) {
        Result::~Result(__return_storage_ptr__);
      }
      if (local_38 == 0) {
        local_21a = 0;
        pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                           ((UniDirectionalLSTMLayerParams *)&x);
        pWVar10 = Specification::LSTMWeightParams::blockinputweightmatrix(pLVar6);
        uVar1 = err.field_2._8_8_;
        uVar11 = err.field_2._8_8_ * uVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,"Unidirectional LSTM",&local_241);
        psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"block input gate weight matrix",&local_269);
        validateGeneralWeightParams
                  (__return_storage_ptr__,pWVar10,uVar11,uVar1,&local_240,psVar9,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator(&local_269);
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator(&local_241);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          local_21a = 1;
        }
        local_38 = (uint)!bVar3;
        if ((local_21a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 == 0) {
          local_26a = 0;
          pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                             ((UniDirectionalLSTMLayerParams *)&x);
          pWVar10 = Specification::LSTMWeightParams::outputgateweightmatrix(pLVar6);
          uVar1 = err.field_2._8_8_;
          uVar8 = err.field_2._8_8_ * uVar8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_290,"Unidirectional LSTM",&local_291);
          psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b8,"output gate weight matrix",&local_2b9);
          validateGeneralWeightParams
                    (__return_storage_ptr__,pWVar10,uVar8,uVar1,&local_290,psVar9,&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::allocator<char>::~allocator(&local_2b9);
          std::__cxx11::string::~string((string *)&local_290);
          std::allocator<char>::~allocator(&local_291);
          bVar3 = Result::good(__return_storage_ptr__);
          if (!bVar3) {
            local_26a = 1;
          }
          local_38 = (uint)!bVar3;
          if ((local_26a & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
          if (local_38 == 0) {
            local_2ba = 0;
            pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                               ((UniDirectionalLSTMLayerParams *)&x);
            pWVar10 = Specification::LSTMWeightParams::inputgaterecursionmatrix(pLVar6);
            uVar1 = err.field_2._8_8_;
            uVar8 = err.field_2._8_8_ * err.field_2._8_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e0,"Unidirectional LSTM",&local_2e1);
            psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_308,"input gate recursion matrix",&local_309);
            validateGeneralWeightParams
                      (__return_storage_ptr__,pWVar10,uVar8,uVar1,&local_2e0,psVar9,&local_308);
            std::__cxx11::string::~string((string *)&local_308);
            std::allocator<char>::~allocator(&local_309);
            std::__cxx11::string::~string((string *)&local_2e0);
            std::allocator<char>::~allocator(&local_2e1);
            bVar3 = Result::good(__return_storage_ptr__);
            if (!bVar3) {
              local_2ba = 1;
            }
            local_38 = (uint)!bVar3;
            if ((local_2ba & 1) == 0) {
              Result::~Result(__return_storage_ptr__);
            }
            if (local_38 == 0) {
              local_30a = 0;
              pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                 ((UniDirectionalLSTMLayerParams *)&x);
              pWVar10 = Specification::LSTMWeightParams::forgetgaterecursionmatrix(pLVar6);
              uVar1 = err.field_2._8_8_;
              uVar8 = err.field_2._8_8_ * err.field_2._8_8_;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_330,"Unidirectional LSTM",&local_331);
              psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_358,"forget gate recursion matrix",&local_359);
              validateGeneralWeightParams
                        (__return_storage_ptr__,pWVar10,uVar8,uVar1,&local_330,psVar9,&local_358);
              std::__cxx11::string::~string((string *)&local_358);
              std::allocator<char>::~allocator(&local_359);
              std::__cxx11::string::~string((string *)&local_330);
              std::allocator<char>::~allocator(&local_331);
              bVar3 = Result::good(__return_storage_ptr__);
              if (!bVar3) {
                local_30a = 1;
              }
              local_38 = (uint)!bVar3;
              if ((local_30a & 1) == 0) {
                Result::~Result(__return_storage_ptr__);
              }
              if (local_38 == 0) {
                local_35a = 0;
                pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                   ((UniDirectionalLSTMLayerParams *)&x);
                pWVar10 = Specification::LSTMWeightParams::blockinputrecursionmatrix(pLVar6);
                uVar1 = err.field_2._8_8_;
                uVar8 = err.field_2._8_8_ * err.field_2._8_8_;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_380,"Unidirectional LSTM",&local_381);
                psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3a8,"block input gate recursion matrix",&local_3a9);
                validateGeneralWeightParams
                          (__return_storage_ptr__,pWVar10,uVar8,uVar1,&local_380,psVar9,&local_3a8);
                std::__cxx11::string::~string((string *)&local_3a8);
                std::allocator<char>::~allocator(&local_3a9);
                std::__cxx11::string::~string((string *)&local_380);
                std::allocator<char>::~allocator(&local_381);
                bVar3 = Result::good(__return_storage_ptr__);
                if (!bVar3) {
                  local_35a = 1;
                }
                local_38 = (uint)!bVar3;
                if ((local_35a & 1) == 0) {
                  Result::~Result(__return_storage_ptr__);
                }
                if (local_38 == 0) {
                  local_3aa = 0;
                  pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                     ((UniDirectionalLSTMLayerParams *)&x);
                  pWVar10 = Specification::LSTMWeightParams::outputgaterecursionmatrix(pLVar6);
                  uVar1 = err.field_2._8_8_;
                  uVar8 = err.field_2._8_8_ * err.field_2._8_8_;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3d0,"Unidirectional LSTM",&local_3d1);
                  psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3f8,"output gate recursion matrix",&local_3f9);
                  validateGeneralWeightParams
                            (__return_storage_ptr__,pWVar10,uVar8,uVar1,&local_3d0,psVar9,&local_3f8
                            );
                  std::__cxx11::string::~string((string *)&local_3f8);
                  std::allocator<char>::~allocator(&local_3f9);
                  std::__cxx11::string::~string((string *)&local_3d0);
                  std::allocator<char>::~allocator(&local_3d1);
                  bVar3 = Result::good(__return_storage_ptr__);
                  if (!bVar3) {
                    local_3aa = 1;
                  }
                  local_38 = (uint)!bVar3;
                  if ((local_3aa & 1) == 0) {
                    Result::~Result(__return_storage_ptr__);
                  }
                  if (local_38 == 0) {
                    pLVar7 = Specification::UniDirectionalLSTMLayerParams::params
                                       ((UniDirectionalLSTMLayerParams *)&x);
                    bVar3 = Specification::LSTMParams::hasbiasvectors(pLVar7);
                    if (bVar3) {
                      local_3fa = 0;
                      pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                         ((UniDirectionalLSTMLayerParams *)&x);
                      pWVar10 = Specification::LSTMWeightParams::inputgatebiasvector(pLVar6);
                      uVar1 = err.field_2._8_8_;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_420,"Unidirectional LSTM",&local_421);
                      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_448,"input gate bias vector",&local_449);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,pWVar10,uVar1,1,&local_420,psVar9,&local_448
                                );
                      std::__cxx11::string::~string((string *)&local_448);
                      std::allocator<char>::~allocator(&local_449);
                      std::__cxx11::string::~string((string *)&local_420);
                      std::allocator<char>::~allocator(&local_421);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) {
                        local_3fa = 1;
                      }
                      local_38 = (uint)!bVar3;
                      if ((local_3fa & 1) == 0) {
                        Result::~Result(__return_storage_ptr__);
                      }
                      if (local_38 != 0) goto LAB_004cc7b9;
                      local_44a = 0;
                      pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                         ((UniDirectionalLSTMLayerParams *)&x);
                      pWVar10 = Specification::LSTMWeightParams::forgetgatebiasvector(pLVar6);
                      uVar1 = err.field_2._8_8_;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_470,"Unidirectional LSTM",&local_471);
                      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_498,"forget gate bias vector",&local_499);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,pWVar10,uVar1,1,&local_470,psVar9,&local_498
                                );
                      std::__cxx11::string::~string((string *)&local_498);
                      std::allocator<char>::~allocator(&local_499);
                      std::__cxx11::string::~string((string *)&local_470);
                      std::allocator<char>::~allocator(&local_471);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) {
                        local_44a = 1;
                      }
                      local_38 = (uint)!bVar3;
                      if ((local_44a & 1) == 0) {
                        Result::~Result(__return_storage_ptr__);
                      }
                      if (local_38 != 0) goto LAB_004cc7b9;
                      local_49a = 0;
                      pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                         ((UniDirectionalLSTMLayerParams *)&x);
                      pWVar10 = Specification::LSTMWeightParams::blockinputbiasvector(pLVar6);
                      uVar1 = err.field_2._8_8_;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_4c0,"Unidirectional LSTM",&local_4c1);
                      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_4e8,"block input bias vector",&local_4e9);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,pWVar10,uVar1,1,&local_4c0,psVar9,&local_4e8
                                );
                      std::__cxx11::string::~string((string *)&local_4e8);
                      std::allocator<char>::~allocator(&local_4e9);
                      std::__cxx11::string::~string((string *)&local_4c0);
                      std::allocator<char>::~allocator(&local_4c1);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) {
                        local_49a = 1;
                      }
                      local_38 = (uint)!bVar3;
                      if ((local_49a & 1) == 0) {
                        Result::~Result(__return_storage_ptr__);
                      }
                      if (local_38 != 0) goto LAB_004cc7b9;
                      local_4ea = 0;
                      pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                         ((UniDirectionalLSTMLayerParams *)&x);
                      pWVar10 = Specification::LSTMWeightParams::outputgatebiasvector(pLVar6);
                      uVar1 = err.field_2._8_8_;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_510,"Unidirectional LSTM",&local_511);
                      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_538,"output gate bias vector",&local_539);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,pWVar10,uVar1,1,&local_510,psVar9,&local_538
                                );
                      std::__cxx11::string::~string((string *)&local_538);
                      std::allocator<char>::~allocator(&local_539);
                      std::__cxx11::string::~string((string *)&local_510);
                      std::allocator<char>::~allocator(&local_511);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) {
                        local_4ea = 1;
                      }
                      local_38 = (uint)!bVar3;
                      if ((local_4ea & 1) == 0) {
                        Result::~Result(__return_storage_ptr__);
                      }
                      if (local_38 != 0) goto LAB_004cc7b9;
                    }
                    pLVar7 = Specification::UniDirectionalLSTMLayerParams::params
                                       ((UniDirectionalLSTMLayerParams *)&x);
                    bVar3 = Specification::LSTMParams::haspeepholevectors(pLVar7);
                    if (bVar3) {
                      local_53a = 0;
                      pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                         ((UniDirectionalLSTMLayerParams *)&x);
                      pWVar10 = Specification::LSTMWeightParams::inputgatepeepholevector(pLVar6);
                      uVar1 = err.field_2._8_8_;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_560,"Unidirectional LSTM",&local_561);
                      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_588,"input gate peep hole vector",&local_589);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,pWVar10,uVar1,1,&local_560,psVar9,&local_588
                                );
                      std::__cxx11::string::~string((string *)&local_588);
                      std::allocator<char>::~allocator(&local_589);
                      std::__cxx11::string::~string((string *)&local_560);
                      std::allocator<char>::~allocator(&local_561);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) {
                        local_53a = 1;
                      }
                      local_38 = (uint)!bVar3;
                      if ((local_53a & 1) == 0) {
                        Result::~Result(__return_storage_ptr__);
                      }
                      if (local_38 != 0) goto LAB_004cc7b9;
                      local_58a = 0;
                      pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                         ((UniDirectionalLSTMLayerParams *)&x);
                      pWVar10 = Specification::LSTMWeightParams::forgetgatepeepholevector(pLVar6);
                      uVar1 = err.field_2._8_8_;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5b0,"Unidirectional LSTM",&local_5b1);
                      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5d8,"forget gate peep hole vector",&local_5d9);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,pWVar10,uVar1,1,&local_5b0,psVar9,&local_5d8
                                );
                      std::__cxx11::string::~string((string *)&local_5d8);
                      std::allocator<char>::~allocator(&local_5d9);
                      std::__cxx11::string::~string((string *)&local_5b0);
                      std::allocator<char>::~allocator(&local_5b1);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) {
                        local_58a = 1;
                      }
                      local_38 = (uint)!bVar3;
                      if ((local_58a & 1) == 0) {
                        Result::~Result(__return_storage_ptr__);
                      }
                      if (local_38 != 0) goto LAB_004cc7b9;
                      local_5da = 0;
                      pLVar6 = Specification::UniDirectionalLSTMLayerParams::weightparams
                                         ((UniDirectionalLSTMLayerParams *)&x);
                      pWVar10 = Specification::LSTMWeightParams::outputgatepeepholevector(pLVar6);
                      uVar1 = err.field_2._8_8_;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_600,"Unidirectional LSTM",&local_601);
                      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_628,"output gate peep hole vector",&local_629);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,pWVar10,uVar1,1,&local_600,psVar9,&local_628
                                );
                      std::__cxx11::string::~string((string *)&local_628);
                      std::allocator<char>::~allocator(&local_629);
                      std::__cxx11::string::~string((string *)&local_600);
                      std::allocator<char>::~allocator(&local_601);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) {
                        local_5da = 1;
                      }
                      local_38 = (uint)!bVar3;
                      if ((local_5da & 1) == 0) {
                        Result::~Result(__return_storage_ptr__);
                      }
                      if (local_38 != 0) goto LAB_004cc7b9;
                    }
                    Result::Result(__return_storage_ptr__);
                    local_38 = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+(&local_178,"Unidirectional LSTM layer:",psVar9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_178," must provide 3 activations");
    std::__cxx11::string::~string((string *)&local_178);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
    local_38 = 1;
    std::__cxx11::string::~string((string *)local_158);
  }
LAB_004cc7b9:
  Specification::UniDirectionalLSTMLayerParams::~UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)&x);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 3));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 3, 3));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "UniDirectionalLSTM", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "UniDirectionalLSTM", 5, 5, blobNameToRank));
    }

    for (const auto& activation : layer.unidirectionallstm().activations()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params()));

    Specification::UniDirectionalLSTMLayerParams recurrent = layer.unidirectionallstm();
    uint64_t x = recurrent.inputvectorsize();
    uint64_t h = recurrent.outputvectorsize();

    if (recurrent.activations_size() != 3){
        const std::string err = std::string("Unidirectional LSTM layer:" + layer.name() + " must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "input gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "forget gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "block input gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "output gate weight matrix"));

    // Check recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "input gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "forget gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputrecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "block input gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "output gate recursion matrix"));

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "input gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "forget gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputbiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "block input bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "output gate bias vector"));
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "input gate peep hole vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "forget gate peep hole vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "output gate peep hole vector"));
    }

    return Result();
}